

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::addUniqueAttribute
          (GLShaderProgram *this,ShaderSpecAttribute *newAttribute)

{
  pointer pGVar1;
  __type _Var2;
  GLShaderAttribute *a;
  pointer __lhs;
  GLShaderAttribute GStack_58;
  
  __lhs = (this->attributes).
          super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__lhs == pGVar1) {
      std::__cxx11::string::string((string *)&GStack_58,(string *)newAttribute);
      GStack_58.type = newAttribute->type;
      GStack_58.arrayCount = newAttribute->arrayCount;
      GStack_58.dataSize = -1;
      GStack_58.location = 0x309;
      GStack_58.VBOLoc = 0x309;
      std::
      vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
      ::emplace_back<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>
                (&this->attributes,&GStack_58);
      std::__cxx11::string::~string((string *)&GStack_58);
      return;
    }
    _Var2 = std::operator==(&__lhs->name,&newAttribute->name);
    if ((_Var2) && (__lhs->type == newAttribute->type)) break;
    __lhs = __lhs + 1;
  }
  return;
}

Assistant:

void GLShaderProgram::addUniqueAttribute(ShaderSpecAttribute newAttribute) {
  for (GLShaderAttribute& a : attributes) {
    if (a.name == newAttribute.name && a.type == newAttribute.type) {
      return;
    }
  }
  attributes.push_back(GLShaderAttribute{newAttribute.name, newAttribute.type, newAttribute.arrayCount, -1, 777, 777});
}